

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase445::run(TestCase445 *this)

{
  DestructionOrderRecorder *pDVar1;
  DestructionOrderRecorder *pDVar2;
  size_t size;
  undefined8 extraout_RDX;
  DestructionOrderRecorder *ptrCopy_1;
  kj *in_RSI;
  char *in_R8;
  DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t> *in_R9;
  DestructionOrderRecorder *ptrCopy;
  DestructionOrderRecorder *ptrCopy_2;
  uint destroyed3;
  DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*&>
  _kjCondition;
  uint destroyed2;
  uint destroyed1;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj3;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> obj2;
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
  local_98;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> combined;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *ptr;
  uint counter;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> arr;
  
  counter = 0;
  destroyed1 = 0;
  destroyed2 = 0;
  destroyed3 = 0;
  pDVar2 = (DestructionOrderRecorder *)operator_new(0x10);
  pDVar2->counter = &counter;
  pDVar2->recordTo = &destroyed1;
  obj2.ptr = (DestructionOrderRecorder *)operator_new(0x10);
  (obj2.ptr)->counter = &counter;
  (obj2.ptr)->recordTo = &destroyed2;
  obj2.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  obj3.ptr = (DestructionOrderRecorder *)operator_new(0x10);
  (obj3.ptr)->counter = &counter;
  (obj3.ptr)->recordTo = &destroyed3;
  obj3.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  heapArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            (&local_98,in_RSI,size);
  ptr = local_98.ptr;
  (local_98.pos)->disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  (local_98.pos)->ptr = pDVar2;
  arr.size_ = (long)local_98.pos + (0x10 - (long)local_98.ptr) >> 4;
  arr.ptr = local_98.ptr;
  arr.disposer = local_98.disposer;
  local_98.ptr = (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)0x0;
  local_98.pos = (RemoveConst<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)0x0;
  local_98.endPtr = (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)0x0;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>::
  attach<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *
             )&_kjCondition,&arr,&obj2);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>::
  attach<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>>
            (&combined,&_kjCondition,&obj3);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::~Array
            ((Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> *
             )&_kjCondition);
  _kjCondition.right = &ptr;
  _kjCondition.result = combined.ptr == ptr;
  _kjCondition.left = combined.ptr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (2 >= _::Debug::minSeverity && !_kjCondition.result) {
    _::Debug::
    log<char_const(&)[41],kj::_::DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>*,kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,decltype(nullptr)>*&>&>
              ((char *)0x1ce,(int)&_kjCondition,
               (LogSeverity)CONCAT71((int7)((ulong)extraout_RDX >> 8),_kjCondition.result),
               (char *)CONCAT71((int7)((ulong)_kjCondition.right >> 8),
                                2 < _::Debug::minSeverity || _kjCondition.result),
               (char (*) [41])in_R8,
               (DebugComparison<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_*&>
                *)in_R9);
  }
  _kjCondition.result = combined.size_ == 1;
  _kjCondition.left =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)combined.size_;
  _kjCondition.right =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)
       CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !_kjCondition.result) {
    in_R8 = "failed: expected combined.size() == 1";
    in_R9 = (DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder_*,_std::nullptr_t>
             *)&_kjCondition;
    _::Debug::log<char_const(&)[38],kj::_::DebugComparison<unsigned_long,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1cf,ERROR,"\"failed: expected \" \"combined.size() == 1\", _kjCondition",
               (char (*) [38])"failed: expected combined.size() == 1",
               (DebugComparison<unsigned_long,_int> *)in_R9);
  }
  pDVar2 = obj2.ptr;
  _kjCondition.right =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)0x0;
  _kjCondition.result = obj2.ptr == (DestructionOrderRecorder *)0x0;
  _kjCondition.left =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)obj2.ptr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !_kjCondition.result) {
    _::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
              ((char *)0x1d2,0x1aaad3,0x1aab0d,(char *)&_kjCondition,(char (*) [39])in_R8,in_R9);
  }
  pDVar1 = obj3.ptr;
  _kjCondition.right =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)0x0;
  _kjCondition.left =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)obj3.ptr;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = obj3.ptr == (DestructionOrderRecorder *)0x0;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<kj::(anonymous_namespace)::DestructionOrderRecorder*,decltype(nullptr)>&>
              ((char *)0x1d3,0x1aab34,0x1aab6e,(char *)&_kjCondition,(char (*) [39])in_R8,in_R9);
  }
  _kjCondition.right =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)
       ((ulong)_kjCondition.right & 0xffffffff00000000);
  _kjCondition.result = destroyed1 == 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _kjCondition.left =
         (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&destroyed1;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1d4,ERROR,"\"failed: expected \" \"destroyed1 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed1 == 0",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition);
  }
  _kjCondition.right =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)
       ((ulong)_kjCondition.right & 0xffffffff00000000);
  _kjCondition.result = destroyed2 == 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _kjCondition.left =
         (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&destroyed2;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1d5,ERROR,"\"failed: expected \" \"destroyed2 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed2 == 0",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition);
  }
  _kjCondition.right =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)
       ((ulong)_kjCondition.right & 0xffffffff00000000);
  _kjCondition.result = destroyed3 == 0;
  _kjCondition.left =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&destroyed3;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1d6,ERROR,"\"failed: expected \" \"destroyed3 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed3 == 0",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition);
  }
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::dispose
            (&combined);
  _kjCondition.result = destroyed1 == 1;
  _kjCondition.right =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)
       CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !_kjCondition.result) {
    _kjCondition.left =
         (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&destroyed1;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1da,ERROR,"\"failed: expected \" \"destroyed1 == 1\", _kjCondition, destroyed1",
               (char (*) [33])"failed: expected destroyed1 == 1",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition,(uint *)&destroyed1);
  }
  _kjCondition.result = destroyed2 == 2;
  _kjCondition.right =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)
       CONCAT44(_kjCondition.right._4_4_,2);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !_kjCondition.result) {
    _kjCondition.left =
         (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&destroyed2;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1db,ERROR,"\"failed: expected \" \"destroyed2 == 2\", _kjCondition, destroyed2",
               (char (*) [33])"failed: expected destroyed2 == 2",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition,(uint *)&destroyed2);
  }
  _kjCondition.result = destroyed3 == 3;
  _kjCondition.left =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *)&destroyed3;
  _kjCondition.right =
       (Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> **)
       CONCAT44(_kjCondition.right._4_4_,3);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1dc,ERROR,"\"failed: expected \" \"destroyed3 == 3\", _kjCondition, destroyed3",
               (char (*) [33])"failed: expected destroyed3 == 3",
               (DebugComparison<unsigned_int_&,_int> *)&_kjCondition,&destroyed3);
  }
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::~Array
            (&combined);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::~Array(&arr)
  ;
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>::
  ~ArrayBuilder(&local_98);
  if (pDVar1 != (DestructionOrderRecorder *)0x0) {
    obj3.ptr = (DestructionOrderRecorder *)0x0;
    (**(obj3.disposer)->_vptr_Disposer)(obj3.disposer,pDVar1);
  }
  if (pDVar2 != (DestructionOrderRecorder *)0x0) {
    obj2.ptr = (DestructionOrderRecorder *)0x0;
    (**(obj2.disposer)->_vptr_Disposer)(obj2.disposer,pDVar2);
  }
  return;
}

Assistant:

TEST(Array, AttachNested) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto builder = kj::heapArrayBuilder<Own<DestructionOrderRecorder>>(1);
  builder.add(kj::mv(obj1));
  auto arr = builder.finish();
  auto ptr = arr.begin();

  Array<Own<DestructionOrderRecorder>> combined = arr.attach(kj::mv(obj2)).attach(kj::mv(obj3));

  KJ_EXPECT(combined.begin() == ptr);
  KJ_EXPECT(combined.size() == 1);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}